

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeinfo.c
# Opt level: O0

void prf_nodeinfo_init(void)

{
  int unaff_retaddr;
  int idx;
  undefined4 local_4;
  
  nodetypes = (prf_nodeinfo_t **)prf_array_init(idx,unaff_retaddr);
  for (local_4 = 0; local_4 < 0x6f; local_4 = local_4 + 1) {
    prf_nodeinfo_set((prf_nodeinfo_t *)CONCAT44(idx,unaff_retaddr));
  }
  prf_header_init();
  prf_group_init();
  prf_object_init();
  prf_face_init();
  prf_push_attribute_init();
  prf_pop_attribute_init();
  prf_push_extension_init();
  prf_pop_extension_init();
  prf_push_level_init();
  prf_pop_level_init();
  prf_push_subface_init();
  prf_pop_subface_init();
  prf_vertex_palette_init();
  prf_vertex_with_color_init();
  prf_obsolete_vertex_with_color_init();
  prf_vertex_with_normal_init();
  prf_obsolete_vertex_with_normal_init();
  prf_vertex_with_normal_and_texture_init();
  prf_vertex_with_texture_init();
  prf_vertex_list_init();
  prf_morph_vertex_list_init();
  prf_color_palette_init();
  prf_material_init();
  prf_texture_init();
  prf_material_palette_init();
  prf_instance_definition_init();
  prf_instance_reference_init();
  prf_matrix_init();
  prf_external_reference_init();
  prf_level_of_detail_init();
  return;
}

Assistant:

void
prf_nodeinfo_init(
    void )
{
    int idx;

    nodetypes = (prf_nodeinfo_t **) prf_array_init(128, sizeof(prf_nodeinfo_t));
    assert(nodetypes != NULL);

    idx = 0;
    while ( idx < (sizeof(prf_nodeinfo_defaults) / sizeof(prf_nodeinfo_defaults[0])) ) {
      /* FIXME: why is commented out code here? 20030425 mortene. */
      /* prf_nodeinfo_defaults[idx].opcode != 0 */
        prf_nodeinfo_set(&prf_nodeinfo_defaults[idx]);
        idx++;
    }

    /* place functions for setting load_f, save_f, and state_f here... */

    prf_header_init();
    prf_group_init();
    prf_object_init();
    prf_face_init();

    prf_push_attribute_init();
    prf_pop_attribute_init();
    prf_push_extension_init();
    prf_pop_extension_init();
    prf_push_level_init();
    prf_pop_level_init();
    prf_push_subface_init();
    prf_pop_subface_init();

    prf_vertex_palette_init();
    prf_vertex_with_color_init();
    prf_obsolete_vertex_with_color_init();
    prf_vertex_with_normal_init();
    prf_obsolete_vertex_with_normal_init();
    prf_vertex_with_normal_and_texture_init();
    prf_vertex_with_texture_init();

    prf_vertex_list_init();
    prf_morph_vertex_list_init();

    prf_color_palette_init();
    prf_material_init();
    prf_texture_init();
    prf_material_palette_init(); /* obsolete */
    prf_instance_definition_init();
    prf_instance_reference_init();

    prf_matrix_init();

    prf_external_reference_init();
    prf_level_of_detail_init();

}